

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilderAsmJs.cpp
# Opt level: O0

LabelInstr * __thiscall
IRBuilderAsmJs::CreateLabel(IRBuilderAsmJs *this,BranchInstr *branchInstr,uint *offset)

{
  code *pcVar1;
  bool bVar2;
  IRKind IVar3;
  undefined4 *puVar4;
  LabelInstr *pLVar5;
  bool local_49;
  LabelInstr *labelInstr;
  Instr *instrPrev;
  Instr *targetInstr;
  uint *offset_local;
  BranchInstr *branchInstr_local;
  IRBuilderAsmJs *this_local;
  
  instrPrev = (Instr *)0x0;
  while (instrPrev == (Instr *)0x0) {
    if (this->m_offsetToInstructionCount <= *offset) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilderAsmJs.cpp"
                         ,0x434,"(offset < m_offsetToInstructionCount)",
                         "offset < m_offsetToInstructionCount");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    instrPrev = this->m_offsetToInstruction[*offset];
    *offset = *offset + 1;
  }
  labelInstr = (LabelInstr *)instrPrev->m_prev;
  if (labelInstr != (LabelInstr *)0x0) {
    labelInstr = (LabelInstr *)IR::Instr::GetPrevRealInstrOrLabel(instrPrev);
  }
  if (labelInstr != (LabelInstr *)0x0) {
    IVar3 = IR::Instr::GetKind(&labelInstr->super_Instr);
    local_49 = true;
    if (IVar3 != InstrKindLabel) {
      local_49 = IR::Instr::IsProfiledLabelInstr(&labelInstr->super_Instr);
    }
    if (local_49 != false) {
      pLVar5 = IR::Instr::AsLabelInstr(&labelInstr->super_Instr);
      return pLVar5;
    }
  }
  pLVar5 = IR::LabelInstr::New(Label,this->m_func,false);
  IR::Instr::SetByteCodeOffset(&pLVar5->super_Instr,*offset);
  if (labelInstr == (LabelInstr *)0x0) {
    IR::Instr::InsertBefore(instrPrev,&pLVar5->super_Instr);
  }
  else {
    IR::Instr::InsertAfter(&labelInstr->super_Instr,&pLVar5->super_Instr);
  }
  return pLVar5;
}

Assistant:

IR::LabelInstr *
IRBuilderAsmJs::CreateLabel(IR::BranchInstr * branchInstr, uint & offset)
{
    IR::Instr * targetInstr = nullptr;
    while (targetInstr == nullptr)
    {
        AssertOrFailFast(offset < m_offsetToInstructionCount);
        targetInstr = m_offsetToInstruction[offset];
        ++offset;
    }

    IR::Instr *instrPrev = targetInstr->m_prev;

    if (instrPrev)
    {
        instrPrev = targetInstr->GetPrevRealInstrOrLabel();
    }

    IR::LabelInstr * labelInstr;
    if (instrPrev && instrPrev->IsLabelInstr())
    {
        // Found an existing label at the right offset. Just reuse it.
        labelInstr = instrPrev->AsLabelInstr();
    }
    else
    {
        // No label at the desired offset. Create one.
        labelInstr = IR::LabelInstr::New(Js::OpCode::Label, m_func);
        labelInstr->SetByteCodeOffset(offset);
        if (instrPrev)
        {
            instrPrev->InsertAfter(labelInstr);
        }
        else
        {
            targetInstr->InsertBefore(labelInstr);
        }
    }
    return labelInstr;
}